

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall Abs<0,_0>::propagate(Abs<0,_0> *this)

{
  Reason r;
  Reason r_00;
  Reason r_01;
  Reason r_02;
  Reason r_03;
  Reason r_04;
  Reason r_05;
  bool bVar1;
  IntView<0> *in_RDI;
  Reason m_r_6;
  int64_t m_v_6;
  Reason m_r_5;
  int64_t m_v_5;
  Reason m_r_4;
  int64_t m_v_4;
  int64_t t;
  Reason m_r_3;
  int64_t m_v_3;
  Reason m_r_2;
  int64_t m_v_2;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  int64_t u;
  int64_t l;
  IntView<0> *in_stack_fffffffffffffee8;
  IntView<0> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  Lit in_stack_ffffffffffffff04;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  Reason local_d8;
  int64_t local_d0;
  anon_union_8_2_743a5d44_for_Reason_0 local_c8;
  int local_c0;
  int local_bc;
  anon_union_8_2_743a5d44_for_Reason_0 local_b8;
  IntView<0> *local_b0;
  IntView<0> *local_a8;
  anon_union_8_2_743a5d44_for_Reason_0 local_a0;
  int local_98;
  int local_94;
  anon_union_8_2_743a5d44_for_Reason_0 local_90;
  long local_88;
  anon_union_8_2_743a5d44_for_Reason_0 local_80;
  int local_74;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  long local_68;
  anon_union_8_2_743a5d44_for_Reason_0 local_60;
  int local_58;
  int local_54;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  IntView<0> *local_48;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  int local_34;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  long local_28;
  IntView<0> *local_20;
  long local_18;
  
  local_18 = IntView<0>::getMin(in_RDI);
  local_20 = (IntView<0> *)IntView<0>::getMax(in_RDI);
  if (local_18 < 0) {
    if ((long)local_20 < 1) {
      local_68 = -(long)local_20;
      bVar1 = IntView<0>::setMinNotR(in_RDI,(int64_t)in_stack_fffffffffffffee8);
      if (bVar1) {
        Reason::Reason((Reason *)&local_70,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          local_74 = (int)IntView<0>::getMaxLit(in_stack_fffffffffffffee8);
          Reason::Reason((Reason *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff04);
        }
        local_80 = local_70;
        r_01.field_0._a._4_4_ = in_stack_ffffffffffffff04.x;
        r_01.field_0._a._0_4_ = in_stack_ffffffffffffff00;
        bVar1 = IntView<0>::setMin(in_stack_fffffffffffffef8,(int64_t)in_RDI,r_01,
                                   SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
        if (!bVar1) {
          return false;
        }
      }
      local_88 = -local_18;
      bVar1 = IntView<0>::setMaxNotR(in_RDI,(int64_t)in_stack_fffffffffffffee8);
      if (bVar1) {
        Reason::Reason((Reason *)&local_90,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          local_94 = (int)IntView<0>::getMaxLit(in_stack_fffffffffffffee8);
          local_98 = (int)IntView<0>::getMinLit(in_stack_fffffffffffffee8);
          Reason::Reason((Reason *)in_stack_ffffffffffffff08._pt,
                         (Lit)(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         (Lit)(int)in_stack_ffffffffffffff10);
        }
        local_a0 = local_90;
        r_02.field_0._a._4_4_ = in_stack_ffffffffffffff04.x;
        r_02.field_0._a._0_4_ = in_stack_ffffffffffffff00;
        bVar1 = IntView<0>::setMax(in_stack_fffffffffffffef8,(int64_t)in_RDI,r_02,
                                   SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
        if (!bVar1) {
          return false;
        }
      }
    }
    else {
      in_stack_fffffffffffffee8 = local_20;
      if ((long)local_20 < -local_18) {
        in_stack_fffffffffffffee8 = (IntView<0> *)-local_18;
      }
      local_b0 = in_stack_fffffffffffffee8;
      local_a8 = in_stack_fffffffffffffee8;
      bVar1 = IntView<0>::setMaxNotR(in_RDI,(int64_t)in_stack_fffffffffffffee8);
      if (bVar1) {
        Reason::Reason((Reason *)&local_b8,(Clause *)0x0);
        if ((so.lazy & 1U) != 0) {
          local_bc = (int)IntView<0>::getMaxLit(in_stack_fffffffffffffee8);
          local_c0 = (int)IntView<0>::getMinLit(in_stack_fffffffffffffee8);
          Reason::Reason((Reason *)in_stack_ffffffffffffff08._pt,
                         (Lit)(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         (Lit)(int)in_stack_ffffffffffffff10);
        }
        local_c8 = local_b8;
        r_03.field_0._a._4_4_ = in_stack_ffffffffffffff04.x;
        r_03.field_0._a._0_4_ = in_stack_ffffffffffffff00;
        bVar1 = IntView<0>::setMax(in_stack_fffffffffffffef8,(int64_t)in_RDI,r_03,
                                   SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
        if (!bVar1) {
          return false;
        }
      }
    }
  }
  else {
    local_28 = local_18;
    bVar1 = IntView<0>::setMinNotR(in_RDI,(int64_t)in_stack_fffffffffffffee8);
    if (bVar1) {
      Reason::Reason((Reason *)&local_30,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_34 = (int)IntView<0>::getMinLit(in_stack_fffffffffffffee8);
        Reason::Reason((Reason *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff04);
      }
      local_40 = local_30;
      r.field_0._a._4_4_ = in_stack_ffffffffffffff04.x;
      r.field_0._a._0_4_ = in_stack_ffffffffffffff00;
      bVar1 = IntView<0>::setMin(in_stack_fffffffffffffef8,(int64_t)in_RDI,r,
                                 SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
    local_48 = local_20;
    bVar1 = IntView<0>::setMaxNotR(in_RDI,(int64_t)in_stack_fffffffffffffee8);
    if (bVar1) {
      Reason::Reason((Reason *)&local_50,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_54 = (int)IntView<0>::getMinLit(in_stack_fffffffffffffee8);
        local_58 = (int)IntView<0>::getMaxLit(in_stack_fffffffffffffee8);
        Reason::Reason((Reason *)in_stack_ffffffffffffff08._pt,
                       (Lit)(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff10);
      }
      local_60 = local_50;
      r_00.field_0._a._4_4_ = in_stack_ffffffffffffff04.x;
      r_00.field_0._a._0_4_ = in_stack_ffffffffffffff00;
      bVar1 = IntView<0>::setMax(in_stack_fffffffffffffef8,(int64_t)in_RDI,r_00,
                                 SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
  }
  local_d0 = IntView<0>::getMax(in_RDI);
  bVar1 = IntView<0>::setMaxNotR(in_RDI,(int64_t)in_stack_fffffffffffffee8);
  if (bVar1) {
    Reason::Reason(&local_d8,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      IntView<0>::getMaxLit(in_stack_fffffffffffffee8);
      Reason::Reason((Reason *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff04);
    }
    r_04.field_0._a._4_4_ = in_stack_ffffffffffffff04.x;
    r_04.field_0._a._0_4_ = in_stack_ffffffffffffff00;
    bVar1 = IntView<0>::setMax(in_stack_fffffffffffffef8,(int64_t)in_RDI,r_04,
                               SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
    if (!bVar1) {
      return false;
    }
  }
  IntView<0>::getMax(in_RDI);
  bVar1 = IntView<0>::setMinNotR(in_RDI,(int64_t)in_stack_fffffffffffffee8);
  if (bVar1) {
    Reason::Reason((Reason *)&stack0xffffffffffffff08,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      in_stack_ffffffffffffff04 = IntView<0>::getMaxLit(in_stack_fffffffffffffee8);
      Reason::Reason((Reason *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff04);
    }
    r_05.field_0._a._4_4_ = in_stack_ffffffffffffff04.x;
    r_05.field_0._a._0_4_ = in_stack_ffffffffffffff00;
    bVar1 = IntView<0>::setMin((IntView<0> *)in_stack_ffffffffffffff08._pt,(int64_t)in_RDI,r_05,
                               SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t l = x.getMin();
		const int64_t u = x.getMax();

		if (l >= 0) {
			setDom(y, setMin, l, x.getMinLit());
			setDom(y, setMax, u, x.getMinLit(), x.getMaxLit());
		} else if (u <= 0) {
			setDom(y, setMin, -u, x.getMaxLit());
			setDom(y, setMax, -l, x.getMaxLit(), x.getMinLit());
		} else {
			// Finesse stronger bound
			const int64_t t = (-l > u ? -l : u);
			setDom(y, setMax, t, x.getMaxLit(), x.getMinLit());
			//			setDom(y, setMax, t, x.getFMaxLit(t), x.getFMinLit(-t));
			//			setDom(y, setMax, t, x.getLit(t+1, LR_GE), x.getLit(-t-1, LR_LE));
		}

		setDom(x, setMax, y.getMax(), y.getMaxLit());
		setDom(x, setMin, -y.getMax(), y.getMaxLit());

		/*
				if (x.isFixed()) {
					if (x.getVal() < 0) {
						setDom(y, setMin, -x.getVal(), x.getMaxLit());
						setDom(y, setMax, -x.getVal(), x.getMinLit());
					} else if (x.getVal() > 0) {
						setDom(y, setMin, x.getVal(), x.getMinLit());
						setDom(y, setMax, x.getVal(), x.getMaxLit());
					} else {
						setDom(y, setVal, 0, x.getMinLit(), x.getMaxLit());
					}
				}
		*/

		return true;
	}